

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_keeper.h
# Opt level: O0

void __thiscall
mp::
ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::IndicatorConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<-1>_>_>_>
::Container::Container
          (Container *this,int d,
          IndicatorConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<_1>_>_> *c)

{
  undefined4 in_ESI;
  IndicatorConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<_1>_>_> *in_RDI;
  IndicatorConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<_1>_>_>
  *in_stack_ffffffffffffff08;
  IndicatorConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<_1>_>_> *pIVar1;
  IndicatorConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<_1>_>_>
  *in_stack_ffffffffffffff20;
  
  pIVar1 = in_RDI;
  IndicatorConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<-1>_>_>::
  IndicatorConstraint(in_stack_ffffffffffffff20,in_RDI);
  ExprWrapper<mp::IndicatorConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<-1>_>_>_>
  ::ExprWrapper((ExprWrapper<mp::IndicatorConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<_1>_>_>_>
                 *)in_RDI,in_stack_ffffffffffffff08);
  IndicatorConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<-1>_>_>::
  ~IndicatorConstraint(in_RDI);
  *(undefined4 *)&pIVar1[1].super_BasicConstraint.name_ = in_ESI;
  Context::Context((Context *)&pIVar1[1].super_BasicConstraint.name_.field_0x4,CTX_NONE);
  *(undefined1 *)&pIVar1[1].super_BasicConstraint.name_._M_string_length = 0;
  *(undefined1 *)((long)&pIVar1[1].super_BasicConstraint.name_._M_string_length + 1) = 0;
  *(undefined1 *)((long)&pIVar1[1].super_BasicConstraint.name_._M_string_length + 2) = 0;
  return;
}

Assistant:

Container(int d, Constraint&& c) noexcept
      : con_(std::move(c)), depth_(d) { }